

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

SrcItem * isSelfJoinView(SrcList *pTabList,SrcItem *pThis,int iFirst,int iEnd)

{
  SrcItem *pSVar1;
  byte bVar2;
  byte bVar3;
  Select *pSVar4;
  Schema *pSVar5;
  Select *pSVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  
  uVar8 = (ulong)(uint)iFirst;
  pSVar4 = ((pThis->u4).pSubq)->pSelect;
  if ((pSVar4->selFlags & 0x1000000) != 0) {
    return (SrcItem *)0x0;
  }
LAB_0018b9ca:
  if (iEnd <= (int)uVar8) {
    return (SrcItem *)0x0;
  }
  uVar7 = (long)(int)uVar8;
LAB_0018b9d5:
  uVar8 = uVar7 + 1;
  if ((*(ushort *)&pTabList->a[uVar7].fg.field_0x1 & 0x44) == 4) {
    pSVar1 = pTabList->a + uVar7;
    if (((pSVar1->zName != (char *)0x0) &&
        (pSVar5 = pSVar1->pSTab->pSchema, pSVar5 == pThis->pSTab->pSchema)) &&
       (pThis->zName != (char *)0x0)) {
      lVar9 = 0;
      do {
        bVar2 = pSVar1->zName[lVar9];
        bVar3 = pThis->zName[lVar9];
        if (bVar2 == bVar3) {
          if ((ulong)bVar2 == 0) goto LAB_0018ba41;
        }
        else if (""[bVar2] != ""[bVar3]) break;
        lVar9 = lVar9 + 1;
      } while( true );
    }
  }
  goto LAB_0018ba0b;
LAB_0018ba41:
  pSVar6 = ((pSVar1->u4).pSubq)->pSelect;
  if ((pSVar5 != (Schema *)0x0) || (pSVar4->selId == pSVar6->selId)) goto LAB_0018ba57;
LAB_0018ba0b:
  uVar7 = uVar8;
  if ((int)uVar8 == iEnd) {
    return (SrcItem *)0x0;
  }
  goto LAB_0018b9d5;
LAB_0018ba57:
  if ((pSVar6->selFlags & 0x1000000) == 0) {
    return pSVar1;
  }
  goto LAB_0018b9ca;
}

Assistant:

static SrcItem *isSelfJoinView(
  SrcList *pTabList,           /* Search for self-joins in this FROM clause */
  SrcItem *pThis,              /* Search for prior reference to this subquery */
  int iFirst, int iEnd        /* Range of FROM-clause entries to search. */
){
  SrcItem *pItem;
  Select *pSel;
  assert( pThis->fg.isSubquery );
  pSel = pThis->u4.pSubq->pSelect;
  assert( pSel!=0 );
  if( pSel->selFlags & SF_PushDown ) return 0;
  while( iFirst<iEnd ){
    Select *pS1;
    pItem = &pTabList->a[iFirst++];
    if( !pItem->fg.isSubquery ) continue;
    if( pItem->fg.viaCoroutine ) continue;
    if( pItem->zName==0 ) continue;
    assert( pItem->pSTab!=0 );
    assert( pThis->pSTab!=0 );
    if( pItem->pSTab->pSchema!=pThis->pSTab->pSchema ) continue;
    if( sqlite3_stricmp(pItem->zName, pThis->zName)!=0 ) continue;
    pS1 = pItem->u4.pSubq->pSelect;
    if( pItem->pSTab->pSchema==0 && pSel->selId!=pS1->selId ){
      /* The query flattener left two different CTE tables with identical
      ** names in the same FROM clause. */
      continue;
    }
    if( pS1->selFlags & SF_PushDown ){
      /* The view was modified by some other optimization such as
      ** pushDownWhereTerms() */
      continue;
    }
    return pItem;
  }
  return 0;
}